

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlNsPtr xmlTreeNSListLookupByPrefix(xmlNsPtr nsList,xmlChar *prefix)

{
  int iVar1;
  xmlNsPtr local_28;
  xmlNsPtr ns;
  xmlChar *prefix_local;
  xmlNsPtr nsList_local;
  
  local_28 = nsList;
  if (nsList != (xmlNsPtr)0x0) {
    do {
      if ((prefix == local_28->prefix) || (iVar1 = xmlStrEqual(prefix,local_28->prefix), iVar1 != 0)
         ) {
        return local_28;
      }
      local_28 = local_28->next;
    } while (local_28 != (_xmlNs *)0x0);
  }
  return (xmlNsPtr)0x0;
}

Assistant:

static xmlNsPtr
xmlTreeNSListLookupByPrefix(xmlNsPtr nsList, const xmlChar *prefix)
{
    if (nsList == NULL)
	return (NULL);
    {
	xmlNsPtr ns;
	ns = nsList;
	do {
	    if ((prefix == ns->prefix) ||
		xmlStrEqual(prefix, ns->prefix)) {
		return (ns);
	    }
	    ns = ns->next;
	} while (ns != NULL);
    }
    return (NULL);
}